

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

size_t loadUnsigned(LoadState *S,size_t limit)

{
  byte bVar1;
  ulong uStack_20;
  int b;
  size_t x;
  size_t limit_local;
  LoadState *S_local;
  
  uStack_20 = 0;
  do {
    bVar1 = loadByte(S);
    if (limit >> 7 <= uStack_20) {
      error(S,"integer overflow");
    }
    uStack_20 = uStack_20 << 7 | (long)(int)(bVar1 & 0x7f);
  } while ((bVar1 & 0x80) == 0);
  return uStack_20;
}

Assistant:

static size_t loadUnsigned (LoadState *S, size_t limit) {
  size_t x = 0;
  int b;
  limit >>= 7;
  do {
    b = loadByte(S);
    if (x >= limit)
      error(S, "integer overflow");
    x = (x << 7) | (b & 0x7f);
  } while ((b & 0x80) == 0);
  return x;
}